

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_embedded_file.cpp
# Opt level: O3

bool __thiscall ON_Buffer::SetCurrentSegment(ON_Buffer *this,bool bWritePending)

{
  ulong uVar1;
  ON_BUFFER_SEGMENT *pOVar2;
  int line_number;
  
  pOVar2 = this->m_current_segment;
  if (pOVar2 == (ON_BUFFER_SEGMENT *)0x0) {
    pOVar2 = *(ON_BUFFER_SEGMENT **)
              (this->m_reserved +
              (ulong)(this->m_buffer_size >> 1 < this->m_current_position) * 8 + -0x24);
    this->m_current_segment = pOVar2;
  }
  if ((!bWritePending) && (this->m_buffer_size <= this->m_current_position)) {
    this->m_current_segment = (ON_BUFFER_SEGMENT *)0x0;
    return false;
  }
  if (((pOVar2 != (ON_BUFFER_SEGMENT *)0x0) &&
      (pOVar2->m_segment_position0 <= this->m_current_position)) &&
     (this->m_current_position < pOVar2->m_segment_position1)) {
    return true;
  }
  if (this->m_first_segment == (ON_BUFFER_SEGMENT *)0x0) {
LAB_0045afec:
    this->m_current_segment = (ON_BUFFER_SEGMENT *)0x0;
  }
  else {
    if (this->m_last_segment == (ON_BUFFER_SEGMENT *)0x0) {
      this->m_current_segment = (ON_BUFFER_SEGMENT *)0x0;
      line_number = 0x3da;
    }
    else {
      uVar1 = this->m_current_position;
      if (this->m_last_segment->m_segment_position1 <= uVar1) goto LAB_0045afec;
      do {
        if (pOVar2->m_segment_position0 <= uVar1) {
          do {
            if (uVar1 < pOVar2->m_segment_position1) {
              return true;
            }
            pOVar2 = pOVar2->m_next_segment;
            this->m_current_segment = pOVar2;
          } while (pOVar2 != (ON_BUFFER_SEGMENT *)0x0);
          return bWritePending;
        }
        pOVar2 = pOVar2->m_prev_segment;
        this->m_current_segment = pOVar2;
      } while (pOVar2 != (ON_BUFFER_SEGMENT *)0x0);
      line_number = 0x3e9;
    }
    bWritePending = false;
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_embedded_file.cpp"
               ,line_number,"","Corrupt ON_Buffer");
  }
  return bWritePending;
}

Assistant:

bool ON_Buffer::SetCurrentSegment( bool bWritePending )
{
  // When ON_Buffer::Write() needs to write at least on byted, it 
  // calls ON_Buffer::SetCurrentSegment(true).
  //   In this case true is returned in all cases unless the information
  //   in the ON_Buffer class is corrupt.
  // When ON_Buffer::Read() needs to read a at least one byte, it
  // calls ON_Buffer::SetCurrentSegment(false).  
  //   In this case, true is returned when m_current_position < m_buffer_size
  //   and false is returned in all other cases.
  //
  // If seeks have occurred since the last read or write, m_current_segment
  // and m_current_segment_offset may need to be updated.
  //

  if ( 0 == m_current_segment )
    m_current_segment = (m_current_position <= m_buffer_size/2) ? m_first_segment : m_last_segment;

  if ( !bWritePending && m_current_position >= m_buffer_size )
  {
    m_current_segment = 0;
    return false; // cannot read past end of buffer
  }

  if ( 0 != m_current_segment 
       && m_current_segment->m_segment_position0 <= m_current_position 
       && m_current_position < m_current_segment->m_segment_position1 
     )
  {
    // The current position is inside of m_current_segment.
    // This happens most of the time which is why this code is at the top
    // of this function.
    return true;
  }

  if ( 0 == m_first_segment )
  {
    // m_current_position can be > 0 if we are writing
    m_current_segment = 0;
    return bWritePending;
  }

  if ( 0 == m_last_segment )
  {
    m_current_segment = 0;
    ON_ERROR("Corrupt ON_Buffer");
    return false;
  }

  if ( m_current_position >= m_last_segment->m_segment_position1 )
  {
    m_current_segment = 0;
    return bWritePending;
  }

  while ( m_current_position < m_current_segment->m_segment_position0 )
  {
    m_current_segment = m_current_segment->m_prev_segment;
    if ( 0 == m_current_segment )
    {
      ON_ERROR("Corrupt ON_Buffer");
      return false;
    }
  }

  while ( m_current_position >= m_current_segment->m_segment_position1 )
  {
    m_current_segment = m_current_segment->m_next_segment;
    if ( 0 == m_current_segment )
      return bWritePending;
  }

  return true;
}